

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_math.h
# Opt level: O0

void grasshopper_copy128(grasshopper_w128_t *to,grasshopper_w128_t *from)

{
  int i;
  grasshopper_w128_t *from_local;
  grasshopper_w128_t *to_local;
  
  for (i = 0; i < 2; i = i + 1) {
    to->q[i] = from->q[i];
  }
  return;
}

Assistant:

static GRASSHOPPER_INLINE void grasshopper_copy128(grasshopper_w128_t* to, const grasshopper_w128_t* from) {
#if(GRASSHOPPER_BITS == 8 || GRASSHOPPER_BITS == 16)
    __builtin_memcpy(&to, &from, sizeof(grasshopper_w128_t));
#else
		int i;
    for (i = 0; i < GRASSHOPPER_BIT_PARTS; i++) {
        GRASSHOPPER_ACCESS_128_VALUE(*to, i) = GRASSHOPPER_ACCESS_128_VALUE(*from, i);
    }
#endif
}